

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

lzham_decompress_state_ptr __thiscall
lzham::lzham_lib_decompress_init(lzham *this,lzham_decompress_params *pParams)

{
  undefined8 uVar1;
  undefined8 uVar2;
  lzham_decompressor *p;
  uchar *puVar3;
  
  if ((((this != (lzham *)0x0) && (*(int *)this == 0x10)) &&
      (0xfffffff0 < *(int *)(this + 4) - 0x1eU)) &&
     (p = lzham_new<lzham::lzham_decompressor>(), p != (lzham_decompressor *)0x0)) {
    uVar1 = *(undefined8 *)this;
    uVar2 = *(undefined8 *)(this + 8);
    (p->m_params).m_struct_size = (int)uVar1;
    (p->m_params).m_dict_size_log2 = (int)((ulong)uVar1 >> 0x20);
    (p->m_params).m_output_unbuffered = (int)uVar2;
    (p->m_params).m_compute_adler32 = (int)((ulong)uVar2 >> 0x20);
    if ((p->m_params).m_output_unbuffered == 0) {
      puVar3 = lzham_new_array<unsigned_char>
                         ((1 << ((byte)(p->m_params).m_dict_size_log2 & 0x1f)) + 0xf);
      p->m_pRaw_decomp_buf = puVar3;
      if (puVar3 == (uchar *)0x0) {
        lzham_delete<lzham::lzham_decompressor>(p);
        return (lzham_decompress_state_ptr)0x0;
      }
      p->m_pDecomp_buf = (uint8 *)((ulong)(puVar3 + 0xf) & 0xfffffffffffffff0);
    }
    else {
      p->m_pRaw_decomp_buf = (uint8 *)0x0;
      p->m_pDecomp_buf = (uint8 *)0x0;
    }
    lzham_decompressor::init(p,(EVP_PKEY_CTX *)pParams);
    return p;
  }
  return (lzham_decompress_state_ptr)0x0;
}

Assistant:

lzham_decompress_state_ptr lzham_lib_decompress_init(const lzham_decompress_params *pParams)
   {
      LZHAM_ASSUME(CLZDecompBase::cMinDictSizeLog2 == LZHAM_MIN_DICT_SIZE_LOG2);
      LZHAM_ASSUME(CLZDecompBase::cMaxDictSizeLog2 == LZHAM_MAX_DICT_SIZE_LOG2_X64);

      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_decompress_params)))
         return NULL;

      if ((pParams->m_dict_size_log2 < CLZDecompBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZDecompBase::cMaxDictSizeLog2))
         return NULL;

      lzham_decompressor *pState = lzham_new<lzham_decompressor>();
      if (!pState)
         return NULL;

      pState->m_params = *pParams;

      if (pState->m_params.m_output_unbuffered)
      {
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         pState->m_pRaw_decomp_buf = lzham_new_array<uint8>(static_cast<uint32>(1U << pState->m_params.m_dict_size_log2) + 15);
         if (!pState->m_pRaw_decomp_buf)
         {
            lzham_delete(pState);
            return NULL;
         }
         pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
      }

      pState->init();

      return pState;
   }